

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.h
# Opt level: O1

bool __thiscall PropertyDef::stdCppSet(PropertyDef *this)

{
  char cVar1;
  int iVar2;
  char ch;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArray local_50;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->name).d.size == 0) {
    bVar3 = false;
  }
  else {
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_38,"set",-1);
    cVar1 = *(this->name).d.ptr;
    ch = cVar1 + -0x20;
    if (0x19 < (int)cVar1 - 0x61U) {
      ch = cVar1;
    }
    QByteArray::append(&local_38,ch);
    QByteArray::mid(&local_50,&this->name,1,-1);
    QByteArray::append(&local_38,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if ((undefined1 *)local_38.d.size == (undefined1 *)(this->write).d.size) {
      if ((undefined1 *)local_38.d.size == (undefined1 *)0x0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp(local_38.d.ptr,(this->write).d.ptr,local_38.d.size);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool stdCppSet() const {
        if (name.isEmpty())
            return false;
        QByteArray s("set");
        s += QtMiscUtils::toAsciiUpper(name[0]);
        s += name.mid(1);
        return (s == write);
    }